

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::DoOffset(ClipperOffset *this,double delta)

{
  EndType EVar1;
  pointer ppPVar2;
  PolyNode *pPVar3;
  pointer pIVar4;
  IntPoint *pt2;
  undefined1 auVar5 [16];
  Path *this_00;
  uint uVar6;
  int iVar7;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *this_01;
  Path *pPVar8;
  int j;
  Paths *this_02;
  int i;
  uint j_00;
  long lVar9;
  ulong uVar10;
  pointer pDVar11;
  pointer pDVar12;
  bool bVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  ulong in_XMM0_Qb;
  double dVar17;
  undefined8 uVar18;
  double dVar19;
  int k;
  undefined1 auStack_d4 [20];
  Path *local_c0;
  Path *local_b8;
  vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_> *local_b0;
  double X;
  double dStack_a0;
  uint local_8c;
  long local_88;
  Paths *local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  this_02 = &this->m_destPolys;
  local_58 = delta;
  uStack_50 = in_XMM0_Qb;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear(this_02);
  this->m_delta = local_58;
  local_48 = ABS(local_58);
  uStack_40 = uStack_50 & 0x7fffffffffffffff;
  if (1e-20 <= local_48) {
    dVar15 = this->MiterLimit;
    dVar19 = this->ArcTolerance;
    this->m_miterLim =
         (double)(~-(ulong)(2.0 < dVar15) & 0x3fe0000000000000 |
                 (ulong)(2.0 / (dVar15 * dVar15)) & -(ulong)(2.0 < dVar15));
    if (dVar19 <= 0.0) {
      dVar15 = 0.25;
    }
    else {
      dVar15 = local_48 * 0.25;
      if (dVar19 <= local_48 * 0.25) {
        dVar15 = dVar19;
      }
    }
    dVar15 = acos(1.0 - dVar15 / local_48);
    local_48 = local_48 * 3.141592653589793;
    if (3.141592653589793 / dVar15 <= local_48) {
      local_48 = 3.141592653589793 / dVar15;
    }
    local_c0 = (Path *)(6.283185307179586 / local_48);
    dVar15 = sin((double)local_c0);
    this->m_sin = dVar15;
    dVar15 = cos((double)local_c0);
    this->m_cos = dVar15;
    this->m_StepsPerRad = local_48 / 6.283185307179586;
    if (local_58 < 0.0) {
      this->m_sin = -this->m_sin;
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_02,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) &
                      0xfffffffffffffffe);
    local_c0 = &this->m_srcPoly;
    local_b8 = &this->m_destPoly;
    this_01 = &this->m_normals;
    local_68 = local_58;
    dStack_60 = local_58;
    local_b0 = this_01;
    local_80 = this_02;
    for (lVar9 = 0;
        ppPVar2 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar9 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2) >> 3
                     ); lVar9 = lVar9 + 1) {
      pPVar3 = ppPVar2[lVar9];
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator=
                (local_c0,&pPVar3->Contour);
      pPVar8 = local_b8;
      uVar10 = (long)(this->m_srcPoly).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_srcPoly).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      X = (double)(uVar10 >> 4);
      iVar7 = SUB84(X,0);
      if ((iVar7 != 0) &&
         ((0.0 < local_58 || ((2 < iVar7 && (pPVar3->m_endtype == etClosedPolygon)))))) {
        pIVar4 = (this->m_destPoly).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->m_destPoly).
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish != pIVar4) {
          (this->m_destPoly).
          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
          super__Vector_impl_data._M_finish = pIVar4;
        }
        local_88 = lVar9;
        if (iVar7 == 1) {
          if (pPVar3->m_jointype == jtRound) {
            dVar15 = 1.0;
            dVar19 = 0.0;
            for (lVar9 = 1; (double)lVar9 <= local_48; lVar9 = lVar9 + 1) {
              pIVar4 = (this->m_srcPoly).
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar16 = dVar15 * local_68 + (double)pIVar4->X;
              dVar17 = dVar19 * dStack_60 + (double)pIVar4->Y;
              uVar10 = -(ulong)(dVar16 < 0.0);
              uVar14 = -(ulong)(dVar17 < 0.0);
              auStack_d4._4_8_ =
                   (long)((double)(uVar14 & 0xbfe0000000000000 | ~uVar14 & 0x3fe0000000000000) +
                         dVar17);
              _k = (double)(long)((double)(uVar10 & 0xbfe0000000000000 |
                                          ~uVar10 & 0x3fe0000000000000) + dVar16);
              X = dVar15;
              dStack_a0 = dVar19;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              emplace_back<ClipperLib::IntPoint>(pPVar8,(IntPoint *)&k);
              dVar15 = X * this->m_cos + -this->m_sin * dStack_a0;
              dVar19 = X * this->m_sin + this->m_cos * dStack_a0;
            }
          }
          else {
            iVar7 = 4;
            X = -1.0;
            dVar15 = -1.0;
            uVar18 = 0;
            while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
              pIVar4 = (local_c0->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              dVar19 = X * local_58 + (double)pIVar4->X;
              uVar10 = -(ulong)(dVar19 < 0.0);
              dVar16 = dVar15 * local_58 + (double)pIVar4->Y;
              uVar14 = -(ulong)(dVar16 < 0.0);
              auStack_d4._4_8_ =
                   (long)((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) +
                         dVar16);
              _k = (double)(long)((double)(~uVar10 & 0x3fe0000000000000 |
                                          uVar10 & 0xbfe0000000000000) + dVar19);
              local_78 = dVar15;
              uStack_70 = uVar18;
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              emplace_back<ClipperLib::IntPoint>(pPVar8,(IntPoint *)&k);
              if (0.0 <= X) {
                if (0.0 <= local_78) {
                  X = -1.0;
                }
                dVar15 = (double)(~-(ulong)(local_78 < 0.0) & (ulong)local_78 |
                                 -(ulong)(local_78 < 0.0) & 0x3ff0000000000000);
                uVar18 = 0;
              }
              else {
                X = 1.0;
                dVar15 = local_78;
                uVar18 = uStack_70;
              }
            }
          }
LAB_0027eec9:
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(this_02,pPVar8);
          this_01 = local_b0;
          lVar9 = local_88;
        }
        else {
          pDVar12 = (this->m_normals).
                    super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->m_normals).
              super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
              _M_impl.super__Vector_impl_data._M_finish != pDVar12) {
            (this->m_normals).
            super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
            _M_impl.super__Vector_impl_data._M_finish = pDVar12;
          }
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::reserve
                    (this_01,(long)iVar7);
          j_00 = iVar7 - 1;
          uVar14 = 0;
          if (0 < (int)j_00) {
            uVar14 = (ulong)j_00;
          }
          for (lVar9 = 0; uVar14 * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
            pIVar4 = (local_c0->
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            _k = GetUnitNormal((IntPoint *)((long)&pIVar4->X + lVar9),
                               (IntPoint *)((long)&pIVar4[1].X + lVar9));
            std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
            emplace_back<ClipperLib::DoublePoint>(local_b0,(DoublePoint *)&k);
          }
          local_78 = (double)(long)(int)j_00;
          if (pPVar3->m_endtype < etOpenButt) {
            pt2 = (local_c0->
                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                  _M_impl.super__Vector_impl_data._M_start;
            _k = GetUnitNormal(pt2 + (long)local_78,pt2);
          }
          else {
            _k = *(DoublePoint *)
                  ((long)&((local_b0->
                           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                           )._M_impl.super__Vector_impl_data._M_start)->X +
                  ((long)(uVar10 * 0x10000000 + -0x200000000) >> 0x1c));
          }
          this_01 = local_b0;
          std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::
          emplace_back<ClipperLib::DoublePoint>(local_b0,(DoublePoint *)&k);
          this_02 = local_80;
          if (pPVar3->m_endtype == etClosedLine) {
            uVar10 = 0;
            iVar7 = 0;
            k = j_00;
            if (0 < SUB84(X,0)) {
              uVar10 = (ulong)X & 0xffffffff;
              iVar7 = 0;
            }
            for (; this_02 = local_80, (int)uVar10 != iVar7; iVar7 = iVar7 + 1) {
              OffsetPoint(this,iVar7,&k,pPVar3->m_jointype);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(local_80,local_b8);
            this_01 = local_b0;
            pIVar4 = (this->m_destPoly).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->m_destPoly).
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
              (this->m_destPoly).
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish = pIVar4;
            }
            pDVar12 = (local_b0->
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            dVar15 = pDVar12[(long)local_78].X;
            dVar19 = pDVar12[(long)local_78].Y;
            pDVar11 = pDVar12 + j_00;
            for (uVar6 = j_00; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
              dVar16 = pDVar11[-1].Y;
              pDVar11->X = -pDVar11[-1].X;
              pDVar11->Y = -dVar16;
              pDVar11 = pDVar11 + -1;
            }
            pDVar12->X = -dVar15;
            pDVar12->Y = -dVar19;
            auVar5._12_4_ = 0;
            auVar5._0_12_ = auStack_d4._0_12_;
            _k = (DoublePoint)(auVar5 << 0x20);
            for (; -1 < (int)j_00; j_00 = j_00 - 1) {
              OffsetPoint(this,j_00,&k,pPVar3->m_jointype);
            }
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(this_02,local_b8);
            lVar9 = local_88;
          }
          else {
            if (pPVar3->m_endtype == etClosedPolygon) {
              k = j_00;
              iVar7 = 0;
              uVar10 = 0;
              if (0 < SUB84(X,0)) {
                uVar10 = (ulong)X & 0xffffffff;
              }
              for (; pPVar8 = local_b8, (int)uVar10 != iVar7; iVar7 = iVar7 + 1) {
                OffsetPoint(this,iVar7,&k,pPVar3->m_jointype);
              }
              goto LAB_0027eec9;
            }
            local_8c = 0;
            for (iVar7 = 1; dVar15 = local_78, this_02 = local_80, pPVar8 = local_b8,
                iVar7 < (int)j_00; iVar7 = iVar7 + 1) {
              OffsetPoint(this,iVar7,(int *)&local_8c,pPVar3->m_jointype);
            }
            _k = (DoublePoint)ZEXT816(0);
            EVar1 = pPVar3->m_endtype;
            if (EVar1 == etOpenButt) {
              pIVar4 = (local_c0->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pDVar12 = (this_01->
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        )._M_impl.super__Vector_impl_data._M_start + (long)local_78;
              dVar19 = pDVar12->X * local_68 + (double)pIVar4[(long)local_78].X;
              dVar16 = pDVar12->Y * dStack_60 + (double)pIVar4[(long)local_78].Y;
              uVar10 = -(ulong)(dVar19 < 0.0);
              uVar14 = -(ulong)(dVar16 < 0.0);
              _k = (double)(long)((double)(~uVar10 & 0x3fe0000000000000 |
                                          uVar10 & 0xbfe0000000000000) + dVar19);
              auStack_d4._4_8_ =
                   (undefined8)
                   ((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) + dVar16);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (local_b8,(value_type *)&k);
              this_01 = local_b0;
              pIVar4 = (local_c0->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pDVar12 = (local_b0->
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        )._M_impl.super__Vector_impl_data._M_start + (long)dVar15;
              dVar19 = (double)pIVar4[(long)dVar15].X - pDVar12->X * local_68;
              dVar15 = (double)pIVar4[(long)dVar15].Y - pDVar12->Y * dStack_60;
              uVar10 = -(ulong)(dVar19 < 0.0);
              uVar14 = -(ulong)(dVar15 < 0.0);
              auStack_d4._4_8_ =
                   (long)((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) +
                         dVar15);
              _k = (double)(long)((double)(~uVar10 & 0x3fe0000000000000 |
                                          uVar10 & 0xbfe0000000000000) + dVar19);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (pPVar8,(value_type *)&k);
              this_02 = local_80;
            }
            else {
              this->m_sinA = 0.0;
              iVar7 = SUB84(X,0) + -2;
              pDVar11 = (this->m_normals).
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pDVar12 = pDVar11 + (long)local_78;
              pDVar11 = pDVar11 + (long)local_78;
              pDVar11->X = -pDVar12->X;
              pDVar11->Y = -pDVar12->Y;
              if (EVar1 == etOpenSquare) {
                DoSquare(this,j_00,iVar7);
              }
              else {
                DoRound(this,j_00,iVar7);
              }
            }
            pDVar12 = (this_01->
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      )._M_impl.super__Vector_impl_data._M_start + j_00;
            for (uVar6 = j_00; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
              dVar15 = pDVar12[-1].Y;
              pDVar12->X = -pDVar12[-1].X;
              pDVar12->Y = -dVar15;
              pDVar12 = pDVar12 + -1;
            }
            pDVar12 = (this_01->
                      super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            dVar15 = pDVar12[1].Y;
            pDVar12->X = -pDVar12[1].X;
            pDVar12->Y = -dVar15;
            local_8c = j_00;
            for (iVar7 = SUB84(X,0) + -2; this_00 = local_b8, pPVar8 = local_c0, 0 < iVar7;
                iVar7 = iVar7 + -1) {
              OffsetPoint(this,iVar7,(int *)&local_8c,pPVar3->m_jointype);
            }
            EVar1 = pPVar3->m_endtype;
            if (EVar1 == etOpenButt) {
              pIVar4 = (local_c0->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pDVar12 = (this_01->
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              dVar15 = (double)pIVar4->X - pDVar12->X * local_68;
              dVar19 = (double)pIVar4->Y - pDVar12->Y * dStack_60;
              uVar10 = -(ulong)(dVar15 < 0.0);
              uVar14 = -(ulong)(dVar19 < 0.0);
              _k = (double)(long)((double)(~uVar10 & 0x3fe0000000000000 |
                                          uVar10 & 0xbfe0000000000000) + dVar15);
              auStack_d4._4_8_ =
                   (undefined8)
                   ((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) + dVar19);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (local_b8,(value_type *)&k);
              pIVar4 = (pPVar8->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pDVar12 = (this_01->
                        super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              dVar15 = pDVar12->X * local_68 + (double)pIVar4->X;
              dVar19 = pDVar12->Y * dStack_60 + (double)pIVar4->Y;
              uVar10 = -(ulong)(dVar15 < 0.0);
              uVar14 = -(ulong)(dVar19 < 0.0);
              auStack_d4._4_8_ =
                   (long)((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) +
                         dVar19);
              _k = (double)(long)((double)(~uVar10 & 0x3fe0000000000000 |
                                          uVar10 & 0xbfe0000000000000) + dVar15);
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                        (this_00,(value_type *)&k);
            }
            else {
              this->m_sinA = 0.0;
              if (EVar1 == etOpenSquare) {
                DoSquare(this,0,1);
              }
              else {
                DoRound(this,0,1);
              }
            }
            lVar9 = local_88;
            std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::push_back(this_02,this_00);
          }
        }
      }
    }
  }
  else {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::reserve(this_02,(long)(int)((ulong)((long)(this->m_polyNodes).Childs.
                                                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_polyNodes).Childs.
                                               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
    for (lVar9 = 0;
        ppPVar2 = (this->m_polyNodes).Childs.
                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar9 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar2) >> 3
                     ); lVar9 = lVar9 + 1) {
      pPVar3 = ppPVar2[lVar9];
      if (pPVar3->m_endtype == etClosedPolygon) {
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(this_02,&pPVar3->Contour);
      }
    }
  }
  return;
}

Assistant:

void ClipperOffset::DoOffset(double delta)
{
  m_destPolys.clear();
  m_delta = delta;

  //if Zero offset, just copy any CLOSED polygons to m_p and return ...
  if (NEAR_ZERO(delta)) 
  {
    m_destPolys.reserve(m_polyNodes.ChildCount());
    for (int i = 0; i < m_polyNodes.ChildCount(); i++)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon)
        m_destPolys.push_back(node.Contour);
    }
    return;
  }

  //see offset_triginometry3.svg in the documentation folder ...
  if (MiterLimit > 2) m_miterLim = 2/(MiterLimit * MiterLimit);
  else m_miterLim = 0.5;

  double y;
  if (ArcTolerance <= 0.0) y = def_arc_tolerance;
  else if (ArcTolerance > std::fabs(delta) * def_arc_tolerance) 
    y = std::fabs(delta) * def_arc_tolerance;
  else y = ArcTolerance;
  //see offset_triginometry2.svg in the documentation folder ...
  double steps = pi / std::acos(1 - y / std::fabs(delta));
  if (steps > std::fabs(delta) * pi) 
    steps = std::fabs(delta) * pi;  //ie excessive precision check
  m_sin = std::sin(two_pi / steps);
  m_cos = std::cos(two_pi / steps);
  m_StepsPerRad = steps / two_pi;
  if (delta < 0.0) m_sin = -m_sin;

  m_destPolys.reserve(m_polyNodes.ChildCount() * 2);
  for (int i = 0; i < m_polyNodes.ChildCount(); i++)
  {
    PolyNode& node = *m_polyNodes.Childs[i];
    m_srcPoly = node.Contour;

    int len = (int)m_srcPoly.size();
    if (len == 0 || (delta <= 0 && (len < 3 || node.m_endtype != etClosedPolygon)))
        continue;

    m_destPoly.clear();
    if (len == 1)
    {
      if (node.m_jointype == jtRound)
      {
        double X = 1.0, Y = 0.0;
        for (cInt j = 1; j <= steps; j++)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          double X2 = X;
          X = X * m_cos - m_sin * Y;
          Y = X2 * m_sin + Y * m_cos;
        }
      }
      else
      {
        double X = -1.0, Y = -1.0;
        for (int j = 0; j < 4; ++j)
        {
          m_destPoly.push_back(IntPoint(
            Round(m_srcPoly[0].X + X * delta),
            Round(m_srcPoly[0].Y + Y * delta)));
          if (X < 0) X = 1;
          else if (Y < 0) Y = 1;
          else X = -1;
        }
      }
      m_destPolys.push_back(m_destPoly);
      continue;
    }
    //build m_normals ...
    m_normals.clear();
    m_normals.reserve(len);
    for (int j = 0; j < len - 1; ++j)
      m_normals.push_back(GetUnitNormal(m_srcPoly[j], m_srcPoly[j + 1]));
    if (node.m_endtype == etClosedLine || node.m_endtype == etClosedPolygon)
      m_normals.push_back(GetUnitNormal(m_srcPoly[len - 1], m_srcPoly[0]));
    else
      m_normals.push_back(DoublePoint(m_normals[len - 2]));

    if (node.m_endtype == etClosedPolygon)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else if (node.m_endtype == etClosedLine)
    {
      int k = len - 1;
      for (int j = 0; j < len; ++j)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
      m_destPoly.clear();
      //re-build m_normals ...
      DoublePoint n = m_normals[len -1];
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-n.X, -n.Y);
      k = 0;
      for (int j = len - 1; j >= 0; j--)
        OffsetPoint(j, k, node.m_jointype);
      m_destPolys.push_back(m_destPoly);
    }
    else
    {
      int k = 0;
      for (int j = 1; j < len - 1; ++j)
        OffsetPoint(j, k, node.m_jointype);

      IntPoint pt1;
      if (node.m_endtype == etOpenButt)
      {
        int j = len - 1;
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X + m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y + m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[j].X - m_normals[j].X *
          delta), (cInt)Round(m_srcPoly[j].Y - m_normals[j].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        int j = len - 1;
        k = len - 2;
        m_sinA = 0;
        m_normals[j] = DoublePoint(-m_normals[j].X, -m_normals[j].Y);
        if (node.m_endtype == etOpenSquare)
          DoSquare(j, k);
        else
          DoRound(j, k);
      }

      //re-build m_normals ...
      for (int j = len - 1; j > 0; j--)
        m_normals[j] = DoublePoint(-m_normals[j - 1].X, -m_normals[j - 1].Y);
      m_normals[0] = DoublePoint(-m_normals[1].X, -m_normals[1].Y);

      k = len - 1;
      for (int j = k - 1; j > 0; --j) OffsetPoint(j, k, node.m_jointype);

      if (node.m_endtype == etOpenButt)
      {
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X - m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y - m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
        pt1 = IntPoint((cInt)Round(m_srcPoly[0].X + m_normals[0].X * delta),
          (cInt)Round(m_srcPoly[0].Y + m_normals[0].Y * delta));
        m_destPoly.push_back(pt1);
      }
      else
      {
        k = 1;
        m_sinA = 0;
        if (node.m_endtype == etOpenSquare)
          DoSquare(0, 1);
        else
          DoRound(0, 1);
      }
      m_destPolys.push_back(m_destPoly);
    }
  }
}